

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O2

void __thiscall inja::Environment::set_comment(Environment *this,string *open,string *close)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::__cxx11::string::_M_assign((string *)&(this->lexer_config).comment_open);
  ::std::operator+(&local_50,open,"-");
  ::std::__cxx11::string::operator=
            ((string *)&(this->lexer_config).comment_open_force_lstrip,(string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::_M_assign((string *)&(this->lexer_config).comment_close);
  ::std::operator+(&local_50,"-",close);
  ::std::__cxx11::string::operator=
            ((string *)&(this->lexer_config).comment_close_force_rstrip,(string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  LexerConfig::update_open_chars(&this->lexer_config);
  return;
}

Assistant:

void set_comment(const std::string& open, const std::string& close) {
    lexer_config.comment_open = open;
    lexer_config.comment_open_force_lstrip = open + "-";
    lexer_config.comment_close = close;
    lexer_config.comment_close_force_rstrip = "-" + close;
    lexer_config.update_open_chars();
  }